

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O3

Scalar RigidBodyDynamics::Utils::CalcPotentialEnergy
                 (Model *model,VectorNd *q,bool update_kinematics)

{
  Index othersize;
  ulong rows;
  Scalar mass;
  Vector3d com;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_58;
  double local_40;
  Vector3d local_38;
  
  rows = (ulong)model->qdot_size;
  local_58.m_storage.m_data = (double *)0x0;
  local_58.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_58,rows,1);
  if (local_58.m_storage.m_rows != rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_58,rows,1);
    rows = local_58.m_storage.m_rows;
  }
  if (0 < (long)rows) {
    memset(local_58.m_storage.m_data,0,rows << 3);
  }
  CalcCenterOfMass(model,q,(VectorNd *)&local_58,(VectorNd *)0x0,&local_40,&local_38,(Vector3d *)0x0
                   ,(Vector3d *)0x0,(Vector3d *)0x0,(Vector3d *)0x0,update_kinematics);
  free(local_58.m_storage.m_data);
  return ((-(model->gravity).super_Vector3d.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] *
           local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1] +
          -(model->gravity).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
          local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0]) -
         (model->gravity).super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2]) * local_40;
}

Assistant:

RBDL_DLLAPI Scalar CalcPotentialEnergy (
  Model &model,
  const Math::VectorNd &q,
  bool update_kinematics)
{
  Scalar mass;
  Vector3d com;
  CalcCenterOfMass (
    model,
    q,
    VectorNd::Zero (model.qdot_size),
    NULL,
    mass,
    com,
    NULL,
    NULL,
    NULL,
    NULL,
    update_kinematics);

  Vector3d g = - Vector3d (model.gravity[0], model.gravity[1], model.gravity[2]);
  LOG << "pot_energy: " << " mass = " << mass << " com = " << com.transpose() <<
      std::endl;

  return mass * com.dot(g);
}